

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lyd_parser_check_keys(lyd_node *node)

{
  long lVar1;
  lysc_node *last;
  lyd_node *plVar2;
  lys_module *plVar3;
  
  if (node->schema->nodetype != 0x10) {
    __assert_fail("node->schema->nodetype == LYS_LIST",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                  ,0x170,"LY_ERR lyd_parser_check_keys(struct lyd_node *)");
  }
  plVar2 = node + 1;
  last = (lysc_node *)0x0;
  while( true ) {
    lVar1 = *(long *)plVar2;
    last = lys_getnext(last,node->schema,(lysc_module *)0x0,0);
    if (last == (lysc_node *)0x0) {
      return LY_SUCCESS;
    }
    if ((last->flags & 0x100) == 0) break;
    if ((lVar1 == 0) || (plVar2 = (lyd_node *)(lVar1 + 0x18), *(lysc_node **)(lVar1 + 8) != last)) {
      if (node->schema == (lysc_node *)0x0) {
        plVar3 = (lys_module *)&node[2].schema;
      }
      else {
        plVar3 = node->schema->module;
      }
      ly_vlog(plVar3->ctx,(char *)0x0,LYVE_DATA,"List instance is missing its key \"%s\".",
              last->name);
      return LY_EVALID;
    }
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyd_parser_check_keys(struct lyd_node *node)
{
    const struct lysc_node *skey = NULL;
    const struct lyd_node *key;

    assert(node->schema->nodetype == LYS_LIST);

    key = lyd_child(node);
    while ((skey = lys_getnext(skey, node->schema, NULL, 0)) && (skey->flags & LYS_KEY)) {
        if (!key || (key->schema != skey)) {
            LOGVAL(LYD_CTX(node), LY_VCODE_NOKEY, skey->name);
            return LY_EVALID;
        }

        key = key->next;
    }

    return LY_SUCCESS;
}